

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MockParameterTest.cpp
# Opt level: O3

void __thiscall
TEST_MockParameterTest_ignoreOtherParametersMultipleCallsButOneDidntHappen_Test::testBody
          (TEST_MockParameterTest_ignoreOtherParametersMultipleCallsButOneDidntHappen_Test *this)

{
  int iVar1;
  MockCheckedExpectedCall *pMVar2;
  UtestShell *test;
  MockSupport *pMVar3;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  MockFailureReporterInstaller failureReporterInstaller;
  MockExpectedCallsListForTest expectations;
  MockExpectedCallsDidntHappenFailure expectedFailure;
  MockFailureReporterInstaller local_a1;
  SimpleString local_a0;
  SimpleString local_90;
  MockExpectedCallsList local_80;
  TestFailure local_70;
  
  MockFailureReporterInstaller::MockFailureReporterInstaller(&local_a1);
  MockExpectedCallsList::MockExpectedCallsList(&local_80);
  local_80._vptr_MockExpectedCallsList = (_func_int **)&PTR__MockExpectedCallsListForTest_002aa030;
  SimpleString::SimpleString((SimpleString *)&local_70,"boo");
  pMVar2 = MockExpectedCallsListForTest::addFunction
                     ((MockExpectedCallsListForTest *)&local_80,(SimpleString *)&local_70);
  SimpleString::~SimpleString((SimpleString *)&local_70);
  (*(pMVar2->super_MockExpectedCall)._vptr_MockExpectedCall[9])(pMVar2);
  (*(pMVar2->super_MockExpectedCall)._vptr_MockExpectedCall[0x36])(pMVar2,1);
  (*(pMVar2->super_MockExpectedCall)._vptr_MockExpectedCall[0x39])(pMVar2);
  (*(pMVar2->super_MockExpectedCall)._vptr_MockExpectedCall[9])(pMVar2);
  SimpleString::SimpleString((SimpleString *)&local_70,"boo");
  pMVar2 = MockExpectedCallsListForTest::addFunction
                     ((MockExpectedCallsListForTest *)&local_80,(SimpleString *)&local_70);
  (*(pMVar2->super_MockExpectedCall)._vptr_MockExpectedCall[9])(pMVar2);
  SimpleString::~SimpleString((SimpleString *)&local_70);
  test = mockFailureTest();
  MockExpectedCallsDidntHappenFailure::MockExpectedCallsDidntHappenFailure
            ((MockExpectedCallsDidntHappenFailure *)&local_70,test,&local_80);
  SimpleString::SimpleString(&local_a0,"");
  pMVar3 = mock(&local_a0,(MockFailureReporter *)0x0);
  SimpleString::SimpleString(&local_90,"boo");
  iVar1 = (*pMVar3->_vptr_MockSupport[3])(pMVar3,&local_90);
  (**(code **)(*(long *)CONCAT44(extraout_var,iVar1) + 0x48))((long *)CONCAT44(extraout_var,iVar1));
  SimpleString::~SimpleString(&local_90);
  SimpleString::~SimpleString(&local_a0);
  SimpleString::SimpleString(&local_a0,"");
  pMVar3 = mock(&local_a0,(MockFailureReporter *)0x0);
  SimpleString::SimpleString(&local_90,"boo");
  iVar1 = (*pMVar3->_vptr_MockSupport[3])(pMVar3,&local_90);
  (**(code **)(*(long *)CONCAT44(extraout_var_00,iVar1) + 0x48))
            ((long *)CONCAT44(extraout_var_00,iVar1));
  SimpleString::~SimpleString(&local_90);
  SimpleString::~SimpleString(&local_a0);
  SimpleString::SimpleString(&local_a0,"");
  pMVar3 = mock(&local_a0,(MockFailureReporter *)0x0);
  SimpleString::SimpleString(&local_90,"boo");
  (*pMVar3->_vptr_MockSupport[6])(pMVar3,&local_90);
  SimpleString::~SimpleString(&local_90);
  SimpleString::~SimpleString(&local_a0);
  SimpleString::SimpleString(&local_a0,"");
  pMVar3 = mock(&local_a0,(MockFailureReporter *)0x0);
  (*pMVar3->_vptr_MockSupport[0x25])(pMVar3);
  SimpleString::~SimpleString(&local_a0);
  CHECK_EXPECTED_MOCK_FAILURE_LOCATION
            ((MockFailure *)&local_70,
             "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTestExt/MockParameterTest.cpp"
             ,0x25f);
  TestFailure::~TestFailure(&local_70);
  MockExpectedCallsListForTest::~MockExpectedCallsListForTest
            ((MockExpectedCallsListForTest *)&local_80);
  MockFailureReporterInstaller::~MockFailureReporterInstaller(&local_a1);
  return;
}

Assistant:

TEST(MockParameterTest, ignoreOtherParametersMultipleCallsButOneDidntHappen)
{
    MockFailureReporterInstaller failureReporterInstaller;

    MockExpectedCallsListForTest expectations;
    MockCheckedExpectedCall* call = expectations.addFunction("boo");
    call->ignoreOtherParameters();
    call->callWasMade(1);
    call->finalizeActualCallMatch();
    call->ignoreOtherParameters();
    expectations.addFunction("boo")->ignoreOtherParameters();
    MockExpectedCallsDidntHappenFailure expectedFailure(mockFailureTest(), expectations);

    mock().expectOneCall("boo").ignoreOtherParameters();
    mock().expectOneCall("boo").ignoreOtherParameters();
    mock().actualCall("boo");

    mock().checkExpectations();
    CHECK_EXPECTED_MOCK_FAILURE(expectedFailure);
}